

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tools.h
# Opt level: O0

int __thiscall vector<server::ban>::remove(vector<server::ban> *this,char *__filename)

{
  int in_EDX;
  int local_24;
  int p;
  int i_local;
  vector<server::ban> *this_local;
  ban *e;
  
  server::ban::ban((ban *)this,(ban *)(*(long *)__filename + (long)in_EDX * 0x18));
  for (local_24 = in_EDX + 1; local_24 < *(int *)(__filename + 0xc); local_24 = local_24 + 1) {
    server::ban::operator=
              ((ban *)(*(long *)__filename + (long)(local_24 + -1) * 0x18),
               (ban *)(*(long *)__filename + (long)local_24 * 0x18));
  }
  *(int *)(__filename + 0xc) = *(int *)(__filename + 0xc) + -1;
  return (int)this;
}

Assistant:

T remove(int i)
    {
        T e = buf[i];
        for(int p = i+1; p<ulen; p++) buf[p-1] = buf[p];
        ulen--;
        return e;
    }